

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O3

void __thiscall
TSMuxer::buildPesHeader(TSMuxer *this,uint8_t pesStreamID,AVPacket *avPacket,int pid)

{
  long dts;
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  long *plVar7;
  pointer puVar8;
  ushort uVar9;
  pointer puVar10;
  pointer __dest;
  long pts;
  uint uVar11;
  int *piVar12;
  undefined1 auVar13 [16];
  PriorityDataInfo tmpPriorityData;
  uint8_t tmpBuffer [2048];
  int local_85c;
  undefined1 local_858 [16];
  long local_848;
  PESPacket local_838 [227];
  undefined1 local_38 [8];
  ulong __new_size;
  
  lVar3 = avPacket->dts / 0xe5b0;
  dts = this->m_timeOffset + lVar3;
  lVar4 = avPacket->pts / 0xe5b0;
  pts = this->m_timeOffset + lVar4;
  memset(local_838,0,0x800);
  if (lVar3 == lVar4) {
    PESPacket::serialize(local_838,pts,pesStreamID);
  }
  else {
    PESPacket::serialize(local_838,pts,dts,pesStreamID);
  }
  this->m_lastPESDTS = dts;
  uVar1 = avPacket->pts;
  uVar2 = avPacket->dts;
  auVar13._8_4_ = (int)uVar1;
  auVar13._0_8_ = uVar2;
  auVar13._12_4_ = (int)((ulong)uVar1 >> 0x20);
  this->m_fullPesDTS = uVar2;
  this->m_fullPesPTS = auVar13._8_8_;
  local_838[0].flagsHi = local_838[0].flagsHi | 4;
  if ((avPacket->codec != (BaseAbstractStreamReader *)0x0) &&
     (plVar7 = (long *)__dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                                      &AbstractStreamReader::typeinfo,0), plVar7 != (long *)0x0)) {
    (**(code **)(*plVar7 + 0x50))(plVar7,local_838,avPacket);
  }
  if ((avPacket->flags & 2) != 0) {
    iVar6 = (uint)(byte)(local_838[0].m_pesHeaderLen + 9) + avPacket->size;
    if (iVar6 == 0) {
      uVar9 = 0;
    }
    else {
      if (iVar6 < 6) {
        __assert_fail("len >= 6",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/pesPacket.h"
                      ,0x91,"void PESPacket::setPacketLength(int32_t)");
      }
      uVar9 = (short)iVar6 - 6;
    }
    local_838[0]._4_2_ = uVar9 << 8 | uVar9 >> 8;
  }
  local_858 = (undefined1  [16])0x0;
  local_848 = 0;
  iVar6 = (*avPacket->codec->_vptr_BaseAbstractStreamReader[2])
                    (avPacket->codec,
                     &local_838[0].startCode0 + (byte)(local_838[0].m_pesHeaderLen + 9),local_38,
                     avPacket);
  uVar11 = iVar6 + (uint)(byte)(local_838[0].m_pesHeaderLen + 9);
  __new_size = (ulong)uVar11;
  (this->m_pesData).m_size = __new_size;
  puVar8 = (this->m_pesData).m_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar10 = (this->m_pesData).m_data.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((ulong)((long)puVar10 - (long)puVar8) < __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&(this->m_pesData).m_data,__new_size);
    puVar8 = (this->m_pesData).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar10 = (this->m_pesData).m_data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  __dest = (pointer)0x0;
  if (puVar8 != puVar10) {
    __dest = puVar8;
  }
  memcpy(__dest,local_838,(long)(int)uVar11);
  uVar5 = local_858._8_8_;
  if (local_858._0_8_ != local_858._8_8_) {
    piVar12 = (int *)local_858._0_8_;
    do {
      local_85c = (uint)(byte)(local_838[0].m_pesHeaderLen + 9) + *piVar12;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 &this->m_priorityData,&local_85c,piVar12 + 1);
      piVar12 = piVar12 + 2;
    } while (piVar12 != (int *)uVar5);
  }
  if ((int *)local_858._0_8_ != (int *)0x0) {
    operator_delete((void *)local_858._0_8_,local_848 - local_858._0_8_);
  }
  return;
}

Assistant:

void TSMuxer::buildPesHeader(const uint8_t pesStreamID, AVPacket& avPacket, int pid)
{
    const int64_t curDts = internalClockToPts(avPacket.dts) + m_timeOffset;
    const int64_t curPts = internalClockToPts(avPacket.pts) + m_timeOffset;
    uint8_t tmpBuffer[2048]{0};
    const auto pesPacket = reinterpret_cast<PESPacket*>(tmpBuffer);
    if (curDts != curPts)
        pesPacket->serialize(curPts, curDts, pesStreamID);
    else
        pesPacket->serialize(curPts, pesStreamID);
    m_lastPESDTS = curDts;
    m_fullPesDTS = avPacket.dts;
    m_fullPesPTS = avPacket.pts;
    pesPacket->flagsHi |= PES_DATA_ALIGNMENT;
    // int additionDataSize = avPacket.codec->writePESExtension(pesPacket);
    const auto ast = dynamic_cast<AbstractStreamReader*>(avPacket.codec);
    if (ast)
        ast->writePESExtension(pesPacket, avPacket);
    if (avPacket.flags & AVPacket::IS_COMPLETE_FRAME)
        pesPacket->setPacketLength(avPacket.size + pesPacket->getHeaderLength());

    PriorityDataInfo tmpPriorityData;
    const int additionDataSize = avPacket.codec->writeAdditionData(
        tmpBuffer + pesPacket->getHeaderLength(), tmpBuffer + sizeof(tmpBuffer), avPacket, &tmpPriorityData);
    const int bufLen = pesPacket->getHeaderLength() + additionDataSize;
    m_pesData.resize(bufLen);
    memcpy(m_pesData.data(), tmpBuffer, bufLen);
    for (auto& i : tmpPriorityData) m_priorityData.emplace_back(i.first + pesPacket->getHeaderLength(), i.second);
}